

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_readresp(Curl_easy *data,int sockindex,pingpong *pp,int *code,size_t *size)

{
  dynbuf *s;
  _Bool _Var1;
  CURLcode CVar2;
  size_t sVar3;
  char *ptr;
  void *pvVar4;
  uint *puVar5;
  ulong size_00;
  size_t local_3d8;
  int local_3cc;
  size_t *local_3c8;
  connectdata *local_3c0;
  char buffer [900];
  
  local_3c0 = data->conn;
  *code = 0;
  *size = 0;
  s = &pp->recvbuf;
  local_3cc = sockindex;
  local_3c8 = size;
  do {
    local_3d8 = 0;
    if (pp->nfinal != 0) {
      sVar3 = Curl_dyn_len(s);
      Curl_dyn_tail(s,sVar3 - pp->nfinal);
      pp->nfinal = 0;
    }
    if (pp->overflow == 0) {
      CVar2 = Curl_conn_recv(data,local_3cc,buffer,900,(ssize_t *)&local_3d8);
      if (CVar2 != CURLE_OK) {
        if (CVar2 == CURLE_AGAIN) {
          return CURLE_OK;
        }
        return CVar2;
      }
      if ((long)local_3d8 < 1) {
        puVar5 = (uint *)__errno_location();
        Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar5);
        return CURLE_RECV_ERROR;
      }
      CVar2 = Curl_dyn_addn(s,buffer,local_3d8);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      puVar5 = &(data->req).headerbytecount;
      *puVar5 = *puVar5 + (int)local_3d8;
      pp->nread_resp = pp->nread_resp + local_3d8;
    }
    while( true ) {
      ptr = Curl_dyn_ptr(s);
      sVar3 = Curl_dyn_len(s);
      pvVar4 = memchr(ptr,10,sVar3);
      if (pvVar4 == (void *)0x0) break;
      size_00 = (long)pvVar4 + (1 - (long)ptr);
      Curl_debug(data,CURLINFO_HEADER_IN,ptr,size_00);
      CVar2 = Curl_client_write(data,2,ptr,size_00);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      _Var1 = (*pp->endofresp)(data,local_3c0,ptr,size_00,code);
      if (_Var1) {
        pp->nfinal = size_00;
        sVar3 = Curl_dyn_len(s);
        if (size_00 < sVar3) {
          sVar3 = Curl_dyn_len(s);
          sVar3 = sVar3 - size_00;
        }
        else {
          sVar3 = 0;
        }
        pp->overflow = sVar3;
        *local_3c8 = pp->nread_resp;
        pp->nread_resp = 0;
        goto LAB_001487da;
      }
      sVar3 = Curl_dyn_len(s);
      if (size_00 < sVar3) {
        sVar3 = Curl_dyn_len(s);
        Curl_dyn_tail(s,sVar3 - size_00);
      }
      else {
        Curl_dyn_reset(s);
      }
    }
    pp->overflow = 0;
    if (local_3d8 != 900) {
LAB_001487da:
      pp->pending_resp = false;
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          int sockindex,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  ssize_t gotbytes;
  char buffer[900];

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  do {
    gotbytes = 0;
    if(pp->nfinal) {
      /* a previous call left this many bytes in the beginning of the buffer as
         that was the final line; now ditch that */
      size_t full = Curl_dyn_len(&pp->recvbuf);

      /* trim off the "final" leading part */
      Curl_dyn_tail(&pp->recvbuf, full -  pp->nfinal);

      pp->nfinal = 0; /* now gone */
    }
    if(!pp->overflow) {
      result = pingpong_read(data, sockindex, buffer, sizeof(buffer),
                             &gotbytes);
      if(result == CURLE_AGAIN)
        return CURLE_OK;

      if(result)
        return result;

      if(gotbytes <= 0) {
        failf(data, "response reading failed (errno: %d)", SOCKERRNO);
        return CURLE_RECV_ERROR;
      }

      result = Curl_dyn_addn(&pp->recvbuf, buffer, gotbytes);
      if(result)
        return result;

      data->req.headerbytecount += (unsigned int)gotbytes;

      pp->nread_resp += gotbytes;
    }

    do {
      char *line = Curl_dyn_ptr(&pp->recvbuf);
      char *nl = memchr(line, '\n', Curl_dyn_len(&pp->recvbuf));
      if(nl) {
        /* a newline is CRLF in pp-talk, so the CR is ignored as
           the line is not really terminated until the LF comes */
        size_t length = nl - line + 1;

        /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
        if(!conn->sec_complete)
#endif
          Curl_debug(data, CURLINFO_HEADER_IN, line, length);

        /*
         * Pass all response-lines to the callback function registered for
         * "headers". The response lines can be seen as a kind of headers.
         */
        result = Curl_client_write(data, CLIENTWRITE_INFO, line, length);
        if(result)
          return result;

        if(pp->endofresp(data, conn, line, length, code)) {
          /* When at "end of response", keep the endofresp line first in the
             buffer since it will be accessed outside (by pingpong
             parsers). Store the overflow counter to inform about additional
             data in this buffer after the endofresp line. */
          pp->nfinal = length;
          if(Curl_dyn_len(&pp->recvbuf) > length)
            pp->overflow = Curl_dyn_len(&pp->recvbuf) - length;
          else
            pp->overflow = 0;
          *size = pp->nread_resp; /* size of the response */
          pp->nread_resp = 0; /* restart */
          gotbytes = 0; /* force break out of outer loop */
          break;
        }
        if(Curl_dyn_len(&pp->recvbuf) > length)
          /* keep the remaining piece */
          Curl_dyn_tail((&pp->recvbuf), Curl_dyn_len(&pp->recvbuf) - length);
        else
          Curl_dyn_reset(&pp->recvbuf);
      }
      else {
        /* without a newline, there is no overflow */
        pp->overflow = 0;
        break;
      }

    } while(1); /* while there is buffer left to scan */

  } while(gotbytes == sizeof(buffer));

  pp->pending_resp = FALSE;

  return result;
}